

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Convert_S32_To_F32_SSE2(int32_t *src,float *dst,uint32_t len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int i;
  long lVar7;
  float *pfVar8;
  int *piVar9;
  
  lVar6 = 0;
  lVar7 = 0;
  for (pfVar8 = dst; (len != (uint32_t)lVar6 && (((ulong)pfVar8 & 0xf) != 0)); pfVar8 = pfVar8 + 1)
  {
    dst[lVar6] = (float)(src[lVar6] >> 8) * 1.192093e-07;
    lVar7 = lVar7 + -4;
    lVar6 = lVar6 + 1;
  }
  piVar9 = (int *)((long)src - lVar7);
  pfVar8 = (float *)((long)dst - lVar7);
  uVar5 = (ulong)len - lVar6;
  iVar4 = (int)uVar5;
  if (((ulong)piVar9 & 0xf) == 0) {
    while (iVar4 = (int)uVar5, 3 < iVar4) {
      iVar1 = piVar9[1];
      iVar2 = piVar9[2];
      iVar3 = piVar9[3];
      *pfVar8 = (float)(*piVar9 >> 8) * 1.192093e-07;
      pfVar8[1] = (float)(iVar1 >> 8) * 1.192093e-07;
      pfVar8[2] = (float)(iVar2 >> 8) * 1.192093e-07;
      pfVar8[3] = (float)(iVar3 >> 8) * 1.192093e-07;
      piVar9 = piVar9 + 4;
      pfVar8 = pfVar8 + 4;
      uVar5 = (ulong)(iVar4 - 4);
    }
  }
  for (lVar6 = 0; iVar4 != (int)lVar6; lVar6 = lVar6 + 1) {
    pfVar8[lVar6] = (float)(piVar9[lVar6] >> 8) * 1.192093e-07;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Convert_S32_To_F32_SSE2(
	const int32_t *restrict src,
	float *restrict dst,
	uint32_t len
) {
    int i;

    /* Get dst aligned to 16 bytes */
    for (i = len; i && (((size_t) dst) & 15); --i, ++src, ++dst) {
        *dst = ((float) (*src>>8)) * DIVBY8388607;
    }

    FAudio_assert(!i || ((((size_t) dst) & 15) == 0));

    /* Make sure src is aligned too. */
    if ((((size_t) src) & 15) == 0) {
        /* Aligned! Do SSE blocks as long as we have 16 bytes available. */
        const __m128 divby8388607 = _mm_set1_ps(DIVBY8388607);
        const __m128i *mmsrc = (const __m128i *) src;
        while (i >= 4) {   /* 4 * sint32 */
            /* shift out lowest bits so int fits in a float32. Small precision loss, but much faster. */
            _mm_store_ps(dst, _mm_mul_ps(_mm_cvtepi32_ps(_mm_srai_epi32(_mm_load_si128(mmsrc), 8)), divby8388607));
            i -= 4; mmsrc++; dst += 4;
        }
        src = (const int32_t *) mmsrc;
    }

    /* Finish off any leftovers with scalar operations. */
    while (i) {
        *dst = ((float) (*src>>8)) * DIVBY8388607;
        i--; src++; dst++;
    }
}